

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNNNUn.cpp
# Opt level: O2

void __thiscall NaPNNNUnit::push_nn(NaPNNNUnit *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (this->need_deck == true) {
    if (this->skip_rest == 0) {
      NaDynAr<NaNNUnit>::addh(&this->deck,this->nn);
    }
    else {
      this->skip_rest = this->skip_rest - 1;
    }
  }
  iVar1 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
  if ((char)iVar1 != '\0') {
    pcVar2 = NaPetriNode::name(&this->super_NaPetriNode);
    pcVar3 = NaConfigPart::GetInstance(&this->nn->super_NaConfigPart);
    NaPrintLog("NaPNNNUnit::push_nn(%p, %s[%s]) --> %u items stored\n",this,pcVar2,pcVar3,
               (ulong)(uint)(this->deck).nItems);
    return;
  }
  return;
}

Assistant:

void
NaPNNNUnit::push_nn ()
{
    if(need_deck) {
	if(skip_rest > 0){
	    --skip_rest;
	}else{
	    deck.addh(*nn);
	    //NaPrintLog("$$$ NaPNNNUnit::push_nn() nn: $$$\n");
	    //nn->PrintLog();
	    //NaPrintLog("$$$ NaPNNNUnit::push_nn() deck: $$$\n");
	    //deck(deck.count()-1).PrintLog();
	}
    } else {
	// do nothing?
    }
    if(is_verbose())
	NaPrintLog("NaPNNNUnit::push_nn(%p, %s[%s]) --> %u items stored\n",
		   this, name(), nn->GetInstance(), deck.count());
}